

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runTests.cpp
# Opt level: O0

void runTests::Run(void)

{
  flux_test::getSource();
  flux_test::setSource();
  flux_test::getTarget();
  flux_test::setTarget();
  flux_test::clearSource();
  flux_test::clearTarget();
  flux_test::comparisonTest();
  flux_test::copyTest();
  model_test::addTest();
  model_test::removeTest();
  model_test::comparisonTest();
  model_test::copyTest();
  system_test::SystemImplTest();
  system_test::getValueTest();
  system_test::setValueTest();
  system_test::comparisonTest();
  return;
}

Assistant:

void runTests::Run() {


    flux_test::getSource();
    flux_test::setSource();
    flux_test::getTarget();
    flux_test::setTarget();
    flux_test::clearSource();
    flux_test::clearTarget();
    flux_test::comparisonTest();
    flux_test::copyTest();

    model_test::addTest();
    model_test::removeTest();
    model_test::comparisonTest();
    model_test::copyTest();

    system_test::SystemImplTest();
    system_test::getValueTest();
    system_test::setValueTest();
    system_test::comparisonTest();
}